

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O0

jas_cmprof_t * jas_cmprof_createfromclrspc(int clrspc)

{
  jas_cmprof_t *pjVar1;
  jas_cmprof_t *prof;
  jas_iccprof_t *iccprof;
  int clrspc_local;
  
  prof = (jas_cmprof_t *)0x0;
  if (clrspc == 0x501) {
    pjVar1 = jas_cmprof_createsycc();
    if (pjVar1 != (jas_cmprof_t *)0x0) {
      return pjVar1;
    }
  }
  else {
    prof = (jas_cmprof_t *)jas_iccprof_createfromclrspc(clrspc);
    if (((jas_iccprof_t *)prof != (jas_iccprof_t *)0x0) &&
       (pjVar1 = jas_cmprof_createfromiccprof((jas_iccprof_t *)prof), pjVar1 != (jas_cmprof_t *)0x0)
       ) {
      jas_iccprof_destroy((jas_iccprof_t *)prof);
      if ((clrspc & 0xffU) == 0) {
        return pjVar1;
      }
      pjVar1->clrspc = clrspc;
      return pjVar1;
    }
  }
  if (prof != (jas_cmprof_t *)0x0) {
    jas_iccprof_destroy((jas_iccprof_t *)prof);
  }
  return (jas_cmprof_t *)0x0;
}

Assistant:

jas_cmprof_t *jas_cmprof_createfromclrspc(int clrspc)
{
	jas_iccprof_t *iccprof;
	jas_cmprof_t *prof;

	iccprof = 0;
	prof = 0;
	switch (clrspc) {
	case JAS_CLRSPC_SYCBCR:
		if (!(prof = jas_cmprof_createsycc()))
			goto error;
		break;
	default:
		if (!(iccprof = jas_iccprof_createfromclrspc(clrspc)))
			goto error;
		if (!(prof = jas_cmprof_createfromiccprof(iccprof)))
			goto error;
		jas_iccprof_destroy(iccprof);
		iccprof = 0;
		if (!jas_clrspc_isgeneric(clrspc))
			prof->clrspc = clrspc;
		break;
	}
	return prof;
error:
	if (iccprof)
		jas_iccprof_destroy(iccprof);
	return 0;
}